

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::parse_line
               (ifstream *file,int min_indent,bool is_list,int *indent,bool *has_list_prefix,
               int *line_idx,string *field_name,ParsedValue *value,bool *syntax_error)

{
  double v;
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  ulong uVar4;
  streamoff sVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  int *in_RCX;
  byte in_DL;
  int in_ESI;
  istream *in_RDI;
  byte *in_R8;
  uint *in_R9;
  undefined1 auVar10 [16];
  string *in_stack_00000008;
  ParsedValue *in_stack_00000010;
  undefined1 *in_stack_00000018;
  char *endptr;
  size_t colon_pos;
  string value_str;
  int prev_indent;
  pos_type prev_file_position;
  string line;
  bool *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe88;
  FILE *pFVar11;
  string *in_stack_fffffffffffffe90;
  char *local_120;
  string local_118 [32];
  string local_f8 [32];
  long local_d8;
  string local_d0 [36];
  undefined4 local_ac;
  string local_a8 [32];
  undefined1 local_88 [16];
  int local_78;
  undefined1 local_68 [16];
  string local_50 [32];
  uint *local_30;
  byte *local_28;
  int *local_20;
  byte local_15;
  int local_14;
  istream *local_10;
  byte local_1;
  
  local_15 = in_DL & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::__cxx11::string::operator=(in_stack_00000008,"");
  *in_stack_00000018 = 0;
  ParsedValue::Clear(in_stack_00000010);
  std::__cxx11::string::string(local_50);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x1366e7);
  local_78 = *local_20;
  do {
    auVar10 = std::istream::tellg();
    local_88 = auVar10;
    local_68 = auVar10;
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_50);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      local_1 = 0;
      local_ac = 1;
      goto LAB_00136c9d;
    }
    cleanup_line(in_stack_fffffffffffffe90);
    get_indent(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::substr((ulong)local_a8,(ulong)local_50);
    std::__cxx11::string::operator=(local_50,local_a8);
    std::__cxx11::string::~string(local_a8);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && ((*local_20 < local_14 || ((0 < local_78 && (*local_20 < local_78)))))
       ) {
      sVar5 = std::fpos::operator_cast_to_long((fpos *)local_68);
      plVar6 = (long *)std::istream::seekg((long)local_10,(_Ios_Seekdir)sVar5);
      bVar2 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
      if ((bVar2 & 1) == 0) {
        local_1 = 0;
        local_ac = 1;
      }
      else {
        fprintf(_stderr,"Failed to seek to previous file position\n");
        *in_stack_00000018 = 1;
        local_1 = 0;
        local_ac = 1;
      }
      goto LAB_00136c9d;
    }
    *local_30 = *local_30 + 1;
    uVar4 = std::__cxx11::string::empty();
  } while ((uVar4 & 1) != 0);
  if ((-1 < local_78) && (local_78 != *local_20)) {
    fprintf(_stderr,"Error: Bad indentation at line %d\n",(ulong)*local_30);
    *in_stack_00000018 = 1;
    local_1 = 0;
    local_ac = 1;
    goto LAB_00136c9d;
  }
  if (((*local_28 & 1) != 0) && ((local_15 & 1) == 0)) {
    fprintf(_stderr,"Error: Unexpected list item at line %d\n",(ulong)*local_30);
    *in_stack_00000018 = 1;
    local_1 = 0;
    local_ac = 1;
    goto LAB_00136c9d;
  }
  std::__cxx11::string::string(local_d0,local_50);
  local_d8 = std::__cxx11::string::find((char)local_50,0x3a);
  if (local_d8 != -1) {
    std::__cxx11::string::substr((ulong)local_f8,(ulong)local_50);
    std::__cxx11::string::operator=(in_stack_00000008,local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::substr((ulong)local_118,(ulong)local_50);
    std::__cxx11::string::operator=(local_d0,local_118);
    std::__cxx11::string::~string(local_118);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    lVar7 = std::__cxx11::string::find((char)local_50,0x2e);
    if (lVar7 == -1) {
      pcVar8 = (char *)std::__cxx11::string::c_str();
      lVar7 = strtol(pcVar8,&local_120,10);
      ParsedValue::SetIntegerValue(in_stack_00000010,lVar7);
      pFVar11 = _stderr;
      if (*local_120 == '\0') goto LAB_00136c68;
      uVar9 = std::__cxx11::string::c_str();
      fprintf(pFVar11,"Error: Failed to parse integer from \'%s\' at line %d\n",uVar9,
              (ulong)*local_30);
      *in_stack_00000018 = 1;
      local_1 = 0;
    }
    else {
      pcVar8 = (char *)std::__cxx11::string::c_str();
      v = strtod(pcVar8,&local_120);
      ParsedValue::SetFloatingPointValue(in_stack_00000010,v);
      if (*local_120 == '\0') goto LAB_00136c68;
      pFVar11 = _stderr;
      uVar9 = std::__cxx11::string::c_str();
      fprintf(pFVar11,"Error: Failed to parse floating point value from \'%s\' at line %d\n",uVar9,
              (ulong)*local_30);
      *in_stack_00000018 = 1;
      local_1 = 0;
    }
  }
  else {
LAB_00136c68:
    local_1 = 1;
  }
  local_ac = 1;
  std::__cxx11::string::~string(local_d0);
LAB_00136c9d:
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_line(std::ifstream &file, int min_indent, bool is_list, int *indent,
                bool *has_list_prefix, int *line_idx, std::string *field_name,
                ParsedValue *value, bool *syntax_error) {
  *field_name = "";
  *syntax_error = false;
  value->Clear();
  std::string line;
  std::ifstream::pos_type prev_file_position;
  const int prev_indent = *indent;
  while (prev_file_position = file.tellg(), std::getline(file, line)) {
    cleanup_line(line);
    get_indent(line, indent, has_list_prefix);
    line = line.substr(*indent);  // skip indentation
    // If the line is indented less than 'min_indent', it belongs to the outer
    // object, and parsing should go back to the previous function in the stack.
    if (!line.empty() &&
        (*indent < min_indent || (prev_indent > 0 && *indent < prev_indent))) {
      // Undo reading the last line.
      if (!file.seekg(prev_file_position, std::ios::beg)) {
        fprintf(stderr, "Failed to seek to previous file position\n");
        *syntax_error = true;
        return false;
      }
      return false;
    }

    ++(*line_idx);
    if (line.empty()) continue;

    if (prev_indent >= 0 && prev_indent != *indent) {
      fprintf(stderr, "Error: Bad indentation at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }
    if (*has_list_prefix && !is_list) {
      fprintf(stderr, "Error: Unexpected list item at line %d\n", *line_idx);
      *syntax_error = true;
      return false;
    }

    std::string value_str = line;
    size_t colon_pos = line.find(':');
    if (colon_pos != std::string::npos) {
      *field_name = line.substr(0, colon_pos);
      value_str = line.substr(colon_pos + 1);
    }
    if (!value_str.empty()) {
      char *endptr;
      if (line.find('.') != std::string::npos) {
        value->SetFloatingPointValue(strtod(value_str.c_str(), &endptr));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse floating point value from '%s' at "
                  "line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      } else {
        value->SetIntegerValue(strtol(value_str.c_str(), &endptr, 10));
        if (*endptr != '\0') {
          fprintf(stderr,
                  "Error: Failed to parse integer from '%s' at line %d\n",
                  value_str.c_str(), *line_idx);
          *syntax_error = true;
          return false;
        }
      }
    }
    return true;
  }
  return false;  // Reached the end of the file.
}